

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

CPAccessResult access_predinv(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint uVar1;
  ARMMMUIdx AVar2;
  uint64_t uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar1 = 0;
      }
      else if (uVar4 == 0x16) {
        uVar1 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar1 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar5 = uVar4 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar1 >> 0x1c & 1) == 0) && (uVar1 = 3, bVar5)) goto LAB_00622e6c;
        }
        uVar1 = 1;
      }
    }
    else {
      uVar1 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar1 = 1;
    if ((env->v7m).exception == 0) {
      uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00622e6c:
  if (uVar1 == 1) {
    uVar3 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar3 >> 0x2a & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  else if ((uVar1 == 0) &&
          (AVar2 = arm_mmu_idx_el_aarch64(env,0),
          (*(byte *)((long)(env->cp15).cptr_el + (ulong)(AVar2 == ARMMMUIdx_E20_0) * 8 + -0x1f) & 4)
          == 0)) {
    return CP_ACCESS_TRAP;
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult access_predinv(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    int el = arm_current_el(env);

    if (el == 0) {
        uint64_t sctlr = arm_sctlr(env, el);
        if (!(sctlr & SCTLR_EnRCTX)) {
            return CP_ACCESS_TRAP;
        }
    } else if (el == 1) {
        uint64_t hcr = arm_hcr_el2_eff(env);
        if (hcr & HCR_NV) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}